

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall HPresolve::removeFreeColumnSingleton(HPresolve *this,int col,int row,int k)

{
  int *piVar1;
  iterator *piVar2;
  double *__args;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  double *pdVar7;
  _Elt_pointer pcVar8;
  ostream *poVar9;
  pointer piVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  timeval tv_1;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> newCosts;
  pair<int,_double> local_70;
  ulong local_60;
  value_type local_58;
  ulong local_40;
  ulong local_38;
  
  gettimeofday((timeval *)&local_58,(__timezone_ptr_t)0x0);
  (this->timer).itemStart[7] =
       (double)(long)local_58.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish / 1000000.0 +
       (double)(long)local_58.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  if (0 < this->iPrint) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PR: Free column singleton ",0x1a);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,col);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," removed. Row ",0xe);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,row);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," removed.",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  local_58.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pair<int,_double> *)0x0;
  local_58.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<int,_double> *)0x0;
  uVar12 = (ulong)row;
  piVar3 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar13 = uVar12;
  if (uVar12 < (ulong)((long)(this->super_HPreData).ARstart.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar3 >> 2)) {
    uVar16 = (ulong)(row + 1);
    piVar10 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar13 = uVar16;
    local_38 = (ulong)(uint)row;
    if (uVar16 < (ulong)((long)(this->super_HPreData).ARstart.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar10 >> 2)) {
      uVar14 = (ulong)piVar3[uVar12];
      local_60 = (ulong)col;
      uVar17 = (ulong)k;
      local_40 = uVar12;
      do {
        uVar12 = local_38;
        uVar13 = local_40;
        if ((long)piVar10[uVar16] <= (long)uVar14) {
          if (this->iKKTcheck == 1) {
            std::
            deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
            ::push_back(&(this->super_HPreData).chk.costs.c,&local_58);
          }
          uVar14 = (ulong)col;
          piVar3 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar16 = uVar14;
          if (uVar14 < (ulong)((long)(this->super_HPreData).flagCol.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar3 >> 2)) {
            piVar3[uVar14] = 0;
            pdVar4 = (this->super_HPreData).colCost.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (uVar14 < (ulong)((long)(this->super_HPreData).colCost.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar4 >> 3)) {
              __args = pdVar4 + uVar14;
              pdVar7 = (this->super_HPreData).postValue.c.
                       super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_cur;
              if (pdVar7 == *(_Elt_pointer *)
                             ((long)&(this->super_HPreData).postValue.c.
                                     super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                     super__Deque_impl_data._M_finish + 0x10) + -1) {
                std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                          ((deque<double,std::allocator<double>> *)&(this->super_HPreData).postValue
                           ,__args);
              }
              else {
                *pdVar7 = *__args;
                (this->super_HPreData).postValue.c.
                super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_cur = pdVar7 + 1;
              }
              iVar15 = (int)uVar12;
              fillStackRowBounds(this,iVar15);
              pdVar4 = (this->super_HPreData).valueColDual.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (uVar14 < (ulong)((long)(this->super_HPreData).valueColDual.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish - (long)pdVar4 >> 3)) {
                pdVar4[uVar14] = 0.0;
                pdVar4 = (this->super_HPreData).colCost.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (uVar14 < (ulong)((long)(this->super_HPreData).colCost.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4
                                    >> 3)) {
                  uVar12 = (ulong)k;
                  pdVar5 = (this->super_HPreData).Avalue.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar16 = uVar12;
                  if ((uVar12 < (ulong)((long)(this->super_HPreData).Avalue.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                        (long)pdVar5 >> 3)) &&
                     (pdVar6 = (this->super_HPreData).valueRowDual.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start, uVar16 = uVar13,
                     uVar13 < (ulong)((long)(this->super_HPreData).valueRowDual.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6
                                     >> 3))) {
                    pdVar6[uVar13] = -pdVar4[uVar14] / pdVar5[uVar12];
                    local_70.first = 7;
                    local_70.second = (double)CONCAT44(local_70.second._4_4_,col);
                    pcVar8 = (this->super_HPreData).chng.c.
                             super__Deque_base<change,_std::allocator<change>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_cur;
                    local_70._4_4_ = iVar15;
                    if (pcVar8 == *(_Elt_pointer *)
                                   ((long)&(this->super_HPreData).chng.c.
                                           super__Deque_base<change,_std::allocator<change>_>.
                                           _M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
                      std::deque<change,std::allocator<change>>::_M_push_back_aux<change_const&>
                                ((deque<change,std::allocator<change>> *)
                                 &(this->super_HPreData).chng,(change *)&local_70);
                    }
                    else {
                      pcVar8->col = col;
                      pcVar8->type = 7;
                      pcVar8->row = iVar15;
                      piVar2 = &(this->super_HPreData).chng.c.
                                super__Deque_base<change,_std::allocator<change>_>._M_impl.
                                super__Deque_impl_data._M_finish;
                      piVar2->_M_cur = piVar2->_M_cur + 1;
                    }
                    removeRow(this,iVar15);
                    piVar1 = (this->countRemovedCols).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start + 7;
                    *piVar1 = *piVar1 + 1;
                    piVar1 = (this->countRemovedRows).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start + 7;
                    *piVar1 = *piVar1 + 1;
                    gettimeofday((timeval *)&local_70,(__timezone_ptr_t)0x0);
                    (this->timer).itemTicks[7] =
                         (((double)(long)local_70.second / 1000000.0 +
                          (double)CONCAT44(local_70._4_4_,local_70.first)) -
                         (this->timer).itemStart[7]) + (this->timer).itemTicks[7];
                    if (local_58.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_58.
                                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    return;
                  }
                }
              }
            }
          }
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar16);
        }
        piVar3 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar13 = uVar14;
        if ((ulong)((long)(this->super_HPreData).ARindex.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar14) break;
        iVar15 = piVar3[uVar14];
        uVar12 = (ulong)iVar15;
        piVar3 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar13 = uVar12;
        if ((ulong)((long)(this->super_HPreData).flagCol.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar12) break;
        if ((iVar15 != col) && (piVar3[uVar12] != 0)) {
          pdVar4 = (this->super_HPreData).colCost.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->super_HPreData).colCost.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar12) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar12);
          }
          local_70.second = pdVar4[uVar12];
          local_70.first = iVar15;
          if (local_58.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_58.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
            _M_realloc_insert<std::pair<int,double>>
                      ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                       &local_58,
                       (iterator)
                       local_58.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_70);
          }
          else {
            *(ulong *)local_58.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = CONCAT44(local_70._4_4_,iVar15);
            (local_58.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->second = local_70.second;
            local_58.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_58.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          pdVar4 = (this->super_HPreData).colCost.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = (long)(this->super_HPreData).colCost.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
          if ((((uVar11 <= uVar12) || (uVar13 = local_60, uVar11 <= local_60)) ||
              (pdVar5 = (this->super_HPreData).ARvalue.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start, uVar13 = uVar14,
              (ulong)((long)(this->super_HPreData).ARvalue.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar14)) ||
             (pdVar6 = (this->super_HPreData).Avalue.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start, uVar13 = uVar17,
             (ulong)((long)(this->super_HPreData).Avalue.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar17)) break;
          pdVar4[uVar12] = pdVar4[uVar12] - (pdVar4[local_60] * pdVar5[uVar14]) / pdVar6[uVar17];
        }
        uVar14 = uVar14 + 1;
        piVar10 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar13 = uVar16;
      } while (uVar16 < (ulong)((long)(this->super_HPreData).ARstart.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)piVar10 >> 2));
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar13);
}

Assistant:

void HPresolve::removeFreeColumnSingleton(const int col, const int row, const int k) {
	timer.recordStart(FREE_SING_COL);
	if (iPrint > 0)
		cout << "PR: Free column singleton " << col << " removed. Row " << row
				<< " removed." << endl;

	//modify costs
	vector<pair<int, double> > newCosts;
	int j;
	for (int kk = ARstart.at(row); kk < ARstart.at(row + 1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j != col) {
			newCosts.push_back(make_pair(j, colCost.at(j)));
			colCost.at(j) = colCost.at(j)
					- colCost.at(col) * ARvalue.at(kk) / Avalue.at(k);
		}
	}
	if (iKKTcheck == 1)
		chk.costs.push(newCosts);

	flagCol.at(col) = 0;
	postValue.push(colCost.at(col));
	fillStackRowBounds (row);

	valueColDual.at(col) = 0;
	valueRowDual.at(row) = -colCost.at(col) / Avalue.at(k);

	addChange(FREE_SING_COL, row, col);
	removeRow(row);

	countRemovedCols[FREE_SING_COL]++;
	countRemovedRows[FREE_SING_COL]++;
	timer.recordFinish(FREE_SING_COL);
}